

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapSetInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapSetInfo *pSVar1;
  Separator local_25;
  uint local_24;
  uint32 i;
  SnapSetInfo *setInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapSetInfo*,(TTD::NSSnapObjects::SnapObjectType)25>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->SetSize,CommaAndBigSpaceSeparator);
  if (pSVar1->SetSize != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (local_24 = 0; local_24 < pSVar1->SetSize; local_24 = local_24 + 1) {
      local_25 = CommaSeparator;
      if (local_24 == 0) {
        local_25 = BigSpaceSeparator;
      }
      NSSnapValues::EmitTTDVar(pSVar1->SetValueArray[local_24],writer,local_25);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapSetInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapSetInfo* setInfo = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject);

            writer->WriteLengthValue(setInfo->SetSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(setInfo->SetSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    NSSnapValues::EmitTTDVar(setInfo->SetValueArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::BigSpaceSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }